

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

int get_byte(MIR_context_t ctx)

{
  reduce_data *prVar1;
  uint8_t *puVar2;
  size_t sVar3;
  ulong uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  uint64_t h;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  uint32_t uVar14;
  size_t len;
  uint8_t tag;
  reduce_reader_t local_50;
  uint8_t *local_48;
  MIR_context_t local_40;
  byte local_38 [8];
  
  prVar1 = ctx->io_ctx->io_reduce_data;
  uVar12 = (prVar1->u).decode.buf_get_pos;
  if (uVar12 < prVar1->buf_bound) {
    local_48 = prVar1->buf + uVar12;
    (prVar1->u).decode.buf_get_pos = uVar12 + 1;
LAB_00121982:
    return (int)*local_48;
  }
  local_40 = ctx;
  if ((prVar1->u).decode.eof_p == '\0') {
    local_50 = (prVar1->u).decode.reader;
    local_48 = prVar1->buf;
    len = 0;
    uVar12 = 0;
    do {
      sVar3 = (*local_50)(&tag,1,prVar1->aux_data);
      if (sVar3 == 0) {
LAB_00121994:
        prVar1->ok_p = '\0';
        goto LAB_0012199c;
      }
      uVar14 = (uint32_t)len;
      if (tag == '\0') {
        pbVar13 = local_38;
        sVar3 = (*local_50)(pbVar13,8,prVar1->aux_data);
        if ((sVar3 == 8) && (sVar3 = (*local_50)(&tag,1,prVar1->aux_data), sVar3 == 0)) {
          if (uVar14 != 0) {
            uVar6 = mir_hash_strict(local_48,len,prVar1->check_hash);
            prVar1->check_hash = uVar6;
          }
          uVar7 = 0;
          for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 8) {
            bVar9 = *pbVar13;
            pbVar13 = pbVar13 + 1;
            uVar7 = uVar7 | (ulong)bVar9 << (uVar4 & 0x3f);
          }
          if (uVar7 == prVar1->check_hash) {
            (prVar1->u).decode.buf_get_pos = 0;
            (prVar1->u).decode.eof_p = '\x01';
            prVar1->buf_bound = uVar14;
            if (uVar14 == 0) goto LAB_0012199c;
            goto LAB_0012197a;
          }
        }
        goto LAB_00121994;
      }
      if (0x1f < tag) {
        uVar4 = (ulong)(uint)(tag >> 5);
        if ((((tag >> 5 == 7) &&
             (uVar4 = _reduce_uint_read(local_50,prVar1->aux_data), (long)uVar4 < 0)) ||
            (uVar11 = (uint)uVar4, 0x7ff < uVar11)) ||
           ((0x40000 < uVar11 + uVar14 ||
            (sVar3 = (*local_50)(local_48 + len,uVar4 & 0xffffffff,prVar1->aux_data),
            sVar3 != (uVar4 & 0xffffffff))))) goto LAB_00121994;
        uVar11 = uVar11 + uVar12;
        uVar8 = uVar12;
        while (iVar10 = (int)uVar4, uVar4 = (ulong)(iVar10 - 1), uVar12 = uVar11, iVar10 != 0) {
          *(int *)((long)&prVar1->u + (ulong)uVar8 * 4 + 0x10) = (int)len;
          len = (size_t)((int)len + 1);
          uVar8 = uVar8 + 1;
        }
      }
      bVar9 = tag & 0x1f;
      if (bVar9 == 0) goto LAB_00121898;
      if (bVar9 == 0x1f) {
        uVar4 = _reduce_uint_read(local_50,prVar1->aux_data);
        if ((long)uVar4 < 0) goto LAB_00121994;
      }
      else {
        uVar4 = (ulong)bVar9;
      }
      iVar5 = _reduce_uint_read(local_50,prVar1->aux_data);
      if ((iVar5 < 0) || (uVar12 < (uint)iVar5)) goto LAB_00121994;
      uVar11 = *(uint *)((long)&prVar1->u + (ulong)(uVar12 - (uint)iVar5) * 4 + 0x10);
      uVar8 = (int)uVar4 + 3;
      if (0x40000 < uVar11 + uVar8) goto LAB_00121994;
      memcpy(local_48 + len,local_48 + uVar11,(ulong)uVar8);
      uVar4 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
      *(int *)((long)&prVar1->u + uVar4 * 4 + 0x10) = (int)len;
      len = (size_t)(uVar8 + (int)len);
LAB_00121898:
      puVar2 = local_48;
    } while ((uint)len < 0x40000);
    if ((uint)len == 0x40000) {
      uVar6 = mir_hash_strict(local_48,0x40000,prVar1->check_hash);
      prVar1->check_hash = uVar6;
      prVar1->buf_bound = 0x40000;
      local_48 = puVar2;
LAB_0012197a:
      (prVar1->u).decode.buf_get_pos = 1;
      goto LAB_00121982;
    }
  }
  else {
LAB_0012199c:
    (*local_40->error_func)(MIR_binary_io_error,"unfinished binary MIR");
  }
  __assert_fail("pos == _REDUCE_BUF_LEN",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-reduce.h"
                ,0x19d,"int reduce_decode_get(struct reduce_data *)");
}

Assistant:

static int get_byte (MIR_context_t ctx) {
#ifdef MIR_NO_BIN_COMPRESSION
  int c = io_reader (ctx);
#else
  int c = reduce_decode_get (io_reduce_data);
#endif

  if (c == EOF) MIR_get_error_func (ctx) (MIR_binary_io_error, "unfinished binary MIR");
  return c;
}